

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O0

char * __thiscall SendBuffer::read_pos(SendBuffer *this)

{
  Error *this_00;
  char *pcVar1;
  SendBuffer *this_local;
  
  if (this->full == 0) {
    this_00 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(this_00,"Buffer is empty");
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
  return pcVar1;
}

Assistant:

char *read_pos() {
    if (full == 0) {
      throw Error("Buffer is empty");
    }
    return &buf[read];
  }